

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::ConstantNamePrefix
                   (string *__return_storage_ptr__,string *classname)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  char **ppcVar6;
  long lVar7;
  string lower;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)classname);
  for (sVar5 = 0; local_48._M_string_length != sVar5; sVar5 = sVar5 + 1) {
    iVar3 = tolower((int)local_48._M_dataplus._M_p[sVar5]);
    local_48._M_dataplus._M_p[sVar5] = (char)iVar3;
  }
  ppcVar6 = kReservedNames;
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar4 == 0x4d) break;
    bVar2 = std::operator==(&local_48,*ppcVar6);
    ppcVar6 = ppcVar6 + 1;
    uVar1 = uVar4 + 1;
  } while (!bVar2);
  lVar7 = 0;
  do {
    if (lVar7 == 0x24) {
      if (uVar4 < 0x4d) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"PB",&local_49);
        goto LAB_002b7586;
      }
      break;
    }
    bVar2 = std::operator==(&local_48,
                            (char *)((long)&_ZL19kValidConstantNames_rel +
                                    (long)*(int *)((long)&_ZL19kValidConstantNames_rel + lVar7)));
    lVar7 = lVar7 + 4;
  } while (!bVar2);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_49);
LAB_002b7586:
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantNamePrefix(const std::string& classname) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}